

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCodeRangeTest(WindowCodeArg *p,int op,int csr1,int regVal,int csr2,int lbl)

{
  Parse *pParse_00;
  int reg;
  int reg_00;
  int iVar1;
  Vdbe *p_00;
  int regString;
  int addrGe;
  int arith;
  int reg2;
  int reg1;
  Vdbe *v;
  Parse *pParse;
  int lbl_local;
  int csr2_local;
  int regVal_local;
  int csr1_local;
  int op_local;
  WindowCodeArg *p_local;
  
  pParse_00 = p->pParse;
  p_00 = sqlite3GetVdbe(pParse_00);
  reg = sqlite3GetTempReg(pParse_00);
  reg_00 = sqlite3GetTempReg(pParse_00);
  regString = 100;
  iVar1 = pParse_00->nMem + 1;
  pParse_00->nMem = iVar1;
  regVal_local = op;
  if (p->pMWin->pOrderBy->a[0].sortOrder != '\0') {
    if (op == 0x36) {
      regVal_local = 0x38;
    }
    else if (op == 0x39) {
      regVal_local = 0x37;
    }
    else {
      regVal_local = 0x39;
    }
    regString = 0x65;
  }
  windowReadPeerValues(p,csr1,reg);
  windowReadPeerValues(p,csr2,reg_00);
  sqlite3VdbeAddOp4(p_00,0x6e,0,iVar1,0,"",-1);
  iVar1 = sqlite3VdbeAddOp3(p_00,0x39,iVar1,0,reg);
  sqlite3VdbeAddOp3(p_00,regString,regVal,reg,reg);
  sqlite3VdbeJumpHere(p_00,iVar1);
  sqlite3VdbeAddOp3(p_00,regVal_local,reg_00,lbl,reg);
  sqlite3VdbeChangeP5(p_00,0x80);
  sqlite3ReleaseTempReg(pParse_00,reg);
  sqlite3ReleaseTempReg(pParse_00,reg_00);
  return;
}

Assistant:

static void windowCodeRangeTest(
  WindowCodeArg *p, 
  int op,                          /* OP_Ge or OP_Gt */
  int csr1, 
  int regVal, 
  int csr2,
  int lbl
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int reg1 = sqlite3GetTempReg(pParse);
  int reg2 = sqlite3GetTempReg(pParse);
  int arith = OP_Add;
  int addrGe;

  int regString = ++pParse->nMem;

  assert( op==OP_Ge || op==OP_Gt || op==OP_Le );
  assert( p->pMWin->pOrderBy && p->pMWin->pOrderBy->nExpr==1 );
  if( p->pMWin->pOrderBy->a[0].sortOrder ){
    switch( op ){
      case OP_Ge: op = OP_Le; break;
      case OP_Gt: op = OP_Lt; break;
      default: assert( op==OP_Le ); op = OP_Ge; break;
    }
    arith = OP_Subtract;
  }

  windowReadPeerValues(p, csr1, reg1);
  windowReadPeerValues(p, csr2, reg2);

  /* Check if the peer value for csr1 value is a text or blob by comparing
  ** it to the smallest possible string - ''. If it is, jump over the
  ** OP_Add or OP_Subtract operation and proceed directly to the comparison. */
  sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
  addrGe = sqlite3VdbeAddOp3(v, OP_Ge, regString, 0, reg1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, arith, regVal, reg1, reg1);
  sqlite3VdbeJumpHere(v, addrGe);
  sqlite3VdbeAddOp3(v, op, reg2, lbl, reg1); VdbeCoverage(v);
  sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
  assert( op==OP_Ge || op==OP_Gt || op==OP_Lt || op==OP_Le );
  testcase(op==OP_Ge); VdbeCoverageIf(v, op==OP_Ge);
  testcase(op==OP_Lt); VdbeCoverageIf(v, op==OP_Lt);
  testcase(op==OP_Le); VdbeCoverageIf(v, op==OP_Le);
  testcase(op==OP_Gt); VdbeCoverageIf(v, op==OP_Gt);

  sqlite3ReleaseTempReg(pParse, reg1);
  sqlite3ReleaseTempReg(pParse, reg2);
}